

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseCompoundLiteralOrCastExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  IndexType openParenTkIdx;
  ostream *poVar3;
  CastExpressionSyntax *pCVar4;
  IndexType closeParenTkIdx;
  TypeNameSyntax *typeName;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == OpenParenToken) {
    openParenTkIdx = consume(this);
    typeName = (TypeNameSyntax *)0x0;
    bVar1 = parseTypeName(this,&typeName);
    if ((bVar1) && (bVar1 = match(this,CloseParenToken,&closeParenTkIdx), bVar1)) {
      pSVar2 = peek(this,1);
      if (pSVar2->syntaxK_ == OpenBraceToken) {
        bVar1 = parseCompoundLiteral_AtOpenBrace(this,expr,openParenTkIdx,typeName,closeParenTkIdx);
        return bVar1;
      }
      pCVar4 = makeNode<psy::C::CastExpressionSyntax>(this);
      *expr = &pCVar4->super_ExpressionSyntax;
      pCVar4->openParenTkIdx_ = openParenTkIdx;
      pCVar4->typeName_ = typeName;
      pCVar4->closeParenTkIdx_ = closeParenTkIdx;
      bVar1 = parseExpressionWithPrecedenceCast(this,&pCVar4->expr_);
      return bVar1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x487);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `(\'");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return false;
}

Assistant:

bool Parser::parseCompoundLiteralOrCastExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenParenToken,
                  return false,
                  "assert failure: `('");

    auto openParenTkIdx = consume();
    TypeNameSyntax* typeName = nullptr;
    if (!parseTypeName(typeName))
        return false;

    LexedTokens::IndexType closeParenTkIdx;
    if (!match(SyntaxKind::CloseParenToken, &closeParenTkIdx))
        return false;

    if (peek().kind() == SyntaxKind::OpenBraceToken)
        return parseCompoundLiteral_AtOpenBrace(expr,
                                                openParenTkIdx,
                                                typeName,
                                                closeParenTkIdx);

    auto castExpr = makeNode<CastExpressionSyntax>();
    expr = castExpr;
    castExpr->openParenTkIdx_ = openParenTkIdx;
    castExpr->typeName_ = typeName;
    castExpr->closeParenTkIdx_ = closeParenTkIdx;
    return parseExpressionWithPrecedenceCast(castExpr->expr_);
}